

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  uint32 value_00;
  int iVar1;
  undefined4 extraout_var;
  
  io::CodedOutputStream::WriteVarint32(output,field_number * 8 + 2);
  value_00 = (*value->_vptr_MessageLite[0xc])(value);
  io::CodedOutputStream::WriteVarint32(output,value_00);
  iVar1 = (*value->_vptr_MessageLite[0xe])(value,output->cur_,output);
  output->cur_ = (uint8 *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

void WireFormatLite::WriteMessageMaybeToArray(int field_number,
                                              const MessageLite& value,
                                              io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  const int size = value.GetCachedSize();
  output->WriteVarint32(size);
  WriteSubMessageMaybeToArray(size, value, output);
}